

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

Expression *
slang::ast::UnboundedLiteral::fromSyntax(ASTContext *context,LiteralExpressionSyntax *syntax)

{
  bool bVar1;
  Compilation *this;
  SourceRange *args_1;
  long in_RDI;
  SourceRange SVar2;
  Compilation *comp;
  Expression *in_stack_ffffffffffffff88;
  Compilation *in_stack_ffffffffffffff90;
  bitmask<slang::ast::ASTFlags> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa8;
  byte bVar3;
  SourceRange in_stack_ffffffffffffffb0;
  bitmask<slang::ast::ASTFlags> local_28;
  Expression *local_8;
  
  this = ASTContext::getCompilation((ASTContext *)0x9effaa);
  args_1 = (SourceRange *)(in_RDI + 0x10);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_28,AllowUnboundedLiteral);
  bVar1 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)args_1,in_stack_ffffffffffffff98);
  bVar3 = 0;
  if (!bVar1) {
    bVar1 = ASTContext::inUnevaluatedBranch((ASTContext *)in_stack_ffffffffffffff90);
    bVar3 = bVar1 ^ 0xff;
  }
  if ((bVar3 & 1) == 0) {
    Compilation::getUnboundedType((Compilation *)0x9f006a);
    SVar2 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this);
    local_8 = &BumpAllocator::
               emplace<slang::ast::UnboundedLiteral,slang::ast::Type_const&,slang::SourceRange>
                         ((BumpAllocator *)SVar2.startLoc,
                          (Type *)CONCAT17(bVar3,in_stack_ffffffffffffffa8),args_1)->
               super_Expression;
  }
  else {
    SVar2 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this);
    ASTContext::addDiag((ASTContext *)CONCAT17(bVar3,in_stack_ffffffffffffffa8),SVar2.startLoc._4_4_
                        ,in_stack_ffffffffffffffb0);
    local_8 = Expression::badExpr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return local_8;
}

Assistant:

Expression& UnboundedLiteral::fromSyntax(const ASTContext& context,
                                         const LiteralExpressionSyntax& syntax) {
    SLANG_ASSERT(syntax.kind == SyntaxKind::WildcardLiteralExpression);

    auto& comp = context.getCompilation();
    if (!context.flags.has(ASTFlags::AllowUnboundedLiteral) && !context.inUnevaluatedBranch()) {
        context.addDiag(diag::UnboundedNotAllowed, syntax.sourceRange());
        return badExpr(comp, nullptr);
    }

    return *comp.emplace<UnboundedLiteral>(comp.getUnboundedType(), syntax.sourceRange());
}